

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void M_Drawer(void)

{
  int iVar1;
  long lVar2;
  AActor *pAVar3;
  uint uVar4;
  player_t *ppVar5;
  
  lVar2 = (long)consoleplayer;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + lVar2 * 0x54));
  uVar4 = 0;
  if (((pAVar3 != (AActor *)0x0) && (uVar4 = 0, screen->Accel2D == false)) &&
     ((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)))) {
    ppVar5 = (player_t *)(&players + lVar2 * 0x54);
    if (pAVar3->player != (player_t *)0x0) {
      ppVar5 = pAVar3->player;
    }
    uVar4 = (int)(ppVar5->BlendB * 255.0) & 0xffU |
            ((int)(ppVar5->BlendG * 255.0) & 0xffU) << 8 |
            ((int)(ppVar5->BlendR * 255.0) & 0xffU) << 0x10 | (int)(ppVar5->BlendA * 255.0) << 0x18;
  }
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    iVar1 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xb])();
    if ((char)iVar1 != '\0') {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xd])
                (screen,(ulong)uVar4);
      V_SetBorderNeedRefresh();
    }
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[10])();
    return;
  }
  return;
}

Assistant:

void M_Drawer (void) 
{
	player_t *player = &players[consoleplayer];
	AActor *camera = player->camera;
	PalEntry fade = 0;

	if (!screen->Accel2D && camera != NULL && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
	{
		if (camera->player != NULL)
		{
			player = camera->player;
		}
		fade = PalEntry (BYTE(player->BlendA*255), BYTE(player->BlendR*255), BYTE(player->BlendG*255), BYTE(player->BlendB*255));
	}


	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		if (DMenu::CurrentMenu->DimAllowed())
		{
			screen->Dim(fade);
			V_SetBorderNeedRefresh();
		}
		DMenu::CurrentMenu->Drawer();
	}
}